

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

void memory_region_add_subregion_common
               (MemoryRegion_conflict *mr,hwaddr offset,MemoryRegion_conflict *subregion)

{
  MemoryRegion *pMVar1;
  
  if (subregion->container != (MemoryRegion_conflict *)0x0) {
    __assert_fail("!subregion->container",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/softmmu/memory.c"
                  ,0x4dd,
                  "void memory_region_add_subregion_common(MemoryRegion *, hwaddr, MemoryRegion *)")
    ;
  }
  subregion->container = mr;
  subregion->addr = offset;
  if (*(long *)((long)&subregion->size + 8) != 0) {
    __assert_fail("r == a",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/int128.h"
                  ,0x16,"uint64_t int128_get64(Int128)");
  }
  subregion->end = offset + (long)subregion->size;
  pMVar1 = (mr->subregions).tqh_first;
  if (pMVar1 != (MemoryRegion *)0x0) {
    do {
      if (pMVar1->priority <= subregion->priority) {
        (subregion->subregions_link).tqe_circ.tql_prev = (pMVar1->subregions_link).tqe_circ.tql_prev
        ;
        (subregion->subregions_link).tqe_next = pMVar1;
        ((pMVar1->subregions_link).tqe_circ.tql_prev)->tql_next = subregion;
        (pMVar1->subregions_link).tqe_circ.tql_prev = (QTailQLink *)&subregion->subregions_link;
        goto LAB_00cf7f4d;
      }
      pMVar1 = (pMVar1->subregions_link).tqe_next;
    } while (pMVar1 != (MemoryRegion *)0x0);
  }
  (subregion->subregions_link).tqe_next = (MemoryRegion *)0x0;
  (subregion->subregions_link).tqe_circ.tql_prev = (mr->subregions).tqh_circ.tql_prev;
  ((mr->subregions).tqh_circ.tql_prev)->tql_next = subregion;
  (mr->subregions).tqh_circ.tql_prev = (QTailQLink *)&subregion->subregions_link;
LAB_00cf7f4d:
  mr->uc->memory_region_update_pending = true;
  memory_region_transaction_commit_tricore(mr);
  return;
}

Assistant:

static void memory_region_add_subregion_common(MemoryRegion *mr,
                                               hwaddr offset,
                                               MemoryRegion *subregion)
{
    assert(!subregion->container);
    subregion->container = mr;
    subregion->addr = offset;
    subregion->end = offset + int128_get64(subregion->size);
    memory_region_update_container_subregions(subregion);
}